

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * merge(char *a,char *b,_func_int_char_ptr_char_ptr *cmp,int offset)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  pcVar3 = a;
  if (b != (char *)0x0) {
    iVar1 = (*cmp)(a,b);
    if (iVar1 < 1) {
      pcVar2 = *(char **)(a + offset);
    }
    else {
      pcVar3 = b;
      b = *(char **)(b + offset);
      pcVar2 = a;
    }
    bVar7 = pcVar2 != (char *)0x0;
    pcVar4 = b;
    pcVar6 = pcVar3;
    pcVar5 = pcVar3;
    if (b != (char *)0x0 && bVar7) {
      do {
        pcVar6 = pcVar2;
        iVar1 = (*cmp)(pcVar6,pcVar4);
        if (iVar1 < 1) {
          *(char **)(pcVar5 + offset) = pcVar6;
          pcVar2 = *(char **)(pcVar6 + offset);
          b = pcVar4;
        }
        else {
          *(char **)(pcVar5 + offset) = pcVar4;
          b = *(char **)(pcVar4 + offset);
          pcVar2 = pcVar6;
          pcVar6 = pcVar4;
        }
        bVar7 = pcVar2 != (char *)0x0;
      } while ((bVar7) && (pcVar4 = b, pcVar5 = pcVar6, b != (char *)0x0));
    }
    if (bVar7) {
      b = pcVar2;
    }
    *(char **)(pcVar6 + offset) = b;
  }
  return pcVar3;
}

Assistant:

static char *merge(
  char *a,
  char *b,
  int (*cmp)(const char*,const char*),
  int offset
){
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}